

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_hash_abort(psa_hash_operation_t *operation)

{
  psa_algorithm_t pVar1;
  psa_hash_operation_t *operation_local;
  
  pVar1 = operation->alg;
  if (pVar1 != 0) {
    if (pVar1 == 0x1000003) {
      mbedtls_md5_free(&(operation->ctx).md5);
    }
    else if (pVar1 == 0x1000004) {
      mbedtls_ripemd160_free(&(operation->ctx).ripemd160);
    }
    else if (pVar1 == 0x1000005) {
      mbedtls_sha1_free(&(operation->ctx).sha1);
    }
    else if (pVar1 + 0xfefffff8 < 2) {
      mbedtls_sha256_free(&(operation->ctx).sha256);
    }
    else {
      if (1 < pVar1 + 0xfefffff6) {
        return -0x89;
      }
      mbedtls_sha512_free(&(operation->ctx).sha512);
    }
  }
  operation->alg = 0;
  return 0;
}

Assistant:

psa_status_t psa_hash_abort( psa_hash_operation_t *operation )
{
    switch( operation->alg )
    {
        case 0:
            /* The object has (apparently) been initialized but it is not
             * in use. It's ok to call abort on such an object, and there's
             * nothing to do. */
            break;
#if defined(MBEDTLS_MD2_C)
        case PSA_ALG_MD2:
            mbedtls_md2_free( &operation->ctx.md2 );
            break;
#endif
#if defined(MBEDTLS_MD4_C)
        case PSA_ALG_MD4:
            mbedtls_md4_free( &operation->ctx.md4 );
            break;
#endif
#if defined(MBEDTLS_MD5_C)
        case PSA_ALG_MD5:
            mbedtls_md5_free( &operation->ctx.md5 );
            break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case PSA_ALG_RIPEMD160:
            mbedtls_ripemd160_free( &operation->ctx.ripemd160 );
            break;
#endif
#if defined(MBEDTLS_SHA1_C)
        case PSA_ALG_SHA_1:
            mbedtls_sha1_free( &operation->ctx.sha1 );
            break;
#endif
#if defined(MBEDTLS_SHA256_C)
        case PSA_ALG_SHA_224:
        case PSA_ALG_SHA_256:
            mbedtls_sha256_free( &operation->ctx.sha256 );
            break;
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case PSA_ALG_SHA_384:
#endif
        case PSA_ALG_SHA_512:
            mbedtls_sha512_free( &operation->ctx.sha512 );
            break;
#endif
        default:
            return( PSA_ERROR_BAD_STATE );
    }
    operation->alg = 0;
    return( PSA_SUCCESS );
}